

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToLiteralsAndBackupInst::Exec
          (SyncToLiteralsAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  char16_t *pcVar2;
  code *pcVar3;
  CharCount CVar4;
  Char *pCVar5;
  bool bVar6;
  uint **ppuVar7;
  undefined4 *puVar8;
  Recycler *pRVar9;
  uint *puVar10;
  ScannerInfo *pSVar11;
  Program *pPVar12;
  char16_t **ppcVar13;
  ScannerInfo *pSVar14;
  CharCountOrFlag local_a4;
  uint local_a0;
  uint local_9c;
  CharCount maxBackup;
  CharCount thisMatchOffset;
  int i_1;
  int i;
  CharCount *literalNextSyncInputOffsets;
  undefined8 local_80;
  TrackAllocData local_78;
  uint local_4c;
  CharCount local_48;
  CharCount bestMatchOffset;
  int besti;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  Char *pCStack_28;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToLiteralsAndBackupInst *this_local;
  
  bestMatchOffset._3_1_ = firstIteration;
  _besti = inputOffset;
  inputOffset_local = matchStart;
  matchStart_local._4_4_ = inputLength;
  pCStack_28 = input;
  input_local = (Char *)matcher;
  matcher_local = (Matcher *)this;
  if (inputLength - *matchStart < (this->super_BackupMixin).backup.lower) {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  else if (*inputOffset < *nextSyncInputOffset) {
    *instPointer = *instPointer + 0x15;
    this_local._7_1_ = false;
  }
  else {
    if (*inputOffset - *matchStart < (this->super_BackupMixin).backup.lower) {
      *inputOffset = *matchStart + (this->super_BackupMixin).backup.lower;
    }
    local_48 = 0xffffffff;
    local_4c = 0;
    ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)&matcher->literalNextSyncInputOffsets);
    if (*ppuVar7 == (uint *)0x0) {
      if (4 < (this->super_ScannersMixin).numLiterals) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x9e1,"(numLiterals <= MaxNumSyncLiterals)",
                           "numLiterals <= MaxNumSyncLiterals");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pRVar9 = *(Recycler **)(input_local + 0x18);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&unsigned_int::typeinfo,0,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                 ,0x9e3);
      pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_78);
      literalNextSyncInputOffsets = (CharCount *)Memory::Recycler::AllocLeaf;
      local_80 = 0;
      puVar10 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                          ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0,4);
      Memory::WriteBarrierPtr<unsigned_int>::operator=
                ((WriteBarrierPtr<unsigned_int> *)(input_local + 0x14),puVar10);
    }
    ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)(input_local + 0x14));
    _i_1 = *ppuVar7;
    if ((bestMatchOffset._3_1_ & 1) != 0) {
      for (thisMatchOffset = 0; (int)thisMatchOffset < (this->super_ScannersMixin).numLiterals;
          thisMatchOffset = thisMatchOffset + 1) {
        _i_1[(int)thisMatchOffset] = *_besti;
      }
    }
    for (maxBackup = 0; uVar1 = local_4c, (int)maxBackup < (this->super_ScannersMixin).numLiterals;
        maxBackup = maxBackup + 1) {
      local_9c = _i_1[(int)maxBackup];
      if (local_9c < *_besti) {
        local_9c = *_besti;
      }
      pSVar11 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                          ((this->super_ScannersMixin).infos + (int)maxBackup);
      if ((pSVar11->isEquivClass & 1U) == 0) {
        pSVar11 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        pCVar5 = pCStack_28;
        CVar4 = matchStart_local._4_4_;
        pPVar12 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->
                            ((WriteBarrierPtr<const_UnifiedRegex::Program> *)(input_local + 8));
        ppcVar13 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                             ((WriteBarrierPtr *)&(pPVar12->rep).insts.litbuf);
        pcVar2 = *ppcVar13;
        pSVar14 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        uVar1 = (pSVar14->super_ScannerMixin).super_LiteralMixin.offset;
        pSVar14 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        bVar6 = TextbookBoyerMoore<char16_t>::Match<1u>
                          (&(pSVar11->super_ScannerMixin).scanner,pCVar5,CVar4,&local_9c,
                           pcVar2 + uVar1,(pSVar14->super_ScannerMixin).super_LiteralMixin.length,
                           *(RegexStats **)(input_local + 0x20));
        if (!bVar6) goto LAB_015e28f2;
LAB_015e28b6:
        if (((int)local_48 < 0) || (local_9c < local_4c)) {
          local_48 = maxBackup;
          local_4c = local_9c;
        }
        _i_1[(int)maxBackup] = local_9c;
      }
      else {
        pSVar11 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        pCVar5 = pCStack_28;
        CVar4 = matchStart_local._4_4_;
        pPVar12 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->
                            ((WriteBarrierPtr<const_UnifiedRegex::Program> *)(input_local + 8));
        ppcVar13 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                             ((WriteBarrierPtr *)&(pPVar12->rep).insts.litbuf);
        pcVar2 = *ppcVar13;
        pSVar14 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        uVar1 = (pSVar14->super_ScannerMixin).super_LiteralMixin.offset;
        pSVar14 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->
                            ((this->super_ScannersMixin).infos + (int)maxBackup);
        bVar6 = TextbookBoyerMoore<char16_t>::Match<4u>
                          (&(pSVar11->super_ScannerMixin).scanner,pCVar5,CVar4,&local_9c,
                           pcVar2 + uVar1,(pSVar14->super_ScannerMixin).super_LiteralMixin.length,
                           *(RegexStats **)(input_local + 0x20));
        if (bVar6) goto LAB_015e28b6;
LAB_015e28f2:
        _i_1[(int)maxBackup] = matchStart_local._4_4_;
      }
    }
    if ((int)local_48 < 0) {
      this_local._7_1_ =
           Matcher::HardFail((Matcher *)input_local,pCStack_28,matchStart_local._4_4_,
                             inputOffset_local,_besti,instPointer,contStack,assertionStack,qcTicks,
                             ImmediateFail);
    }
    else {
      *nextSyncInputOffset = local_4c + 1;
      if ((this->super_BackupMixin).backup.upper != 0xffffffff) {
        local_a0 = local_4c - *inputOffset_local;
        local_a4 = (this->super_BackupMixin).backup.upper;
        puVar10 = min<unsigned_int>(&local_a0,&local_a4);
        *inputOffset_local = uVar1 - *puVar10;
      }
      *_besti = *inputOffset_local;
      *instPointer = *instPointer + 0x15;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToLiteralsAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        int besti = -1;
        CharCount bestMatchOffset = 0;

        if (matcher.literalNextSyncInputOffsets == nullptr)
        {
            Assert(numLiterals <= MaxNumSyncLiterals);
            matcher.literalNextSyncInputOffsets =
                RecyclerNewArrayLeaf(matcher.recycler, CharCount, ScannersMixin::MaxNumSyncLiterals);
        }
        CharCount* literalNextSyncInputOffsets = matcher.literalNextSyncInputOffsets;

        if (firstIteration)
        {
            for (int i = 0; i < numLiterals; i++)
            {
                literalNextSyncInputOffsets[i] = inputOffset;
            }
        }

        for (int i = 0; i < numLiterals; i++)
        {
            CharCount thisMatchOffset = literalNextSyncInputOffsets[i];
            if (inputOffset > thisMatchOffset)
            {
                thisMatchOffset = inputOffset;
            }

            if (infos[i]->isEquivClass
                ? (infos[i]->scanner.Match<CaseInsensitive::EquivClassSize>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    ))
                : (infos[i]->scanner.Match<1>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    )))
            {
                if (besti < 0 || thisMatchOffset < bestMatchOffset)
                {
                    besti = i;
                    bestMatchOffset = thisMatchOffset;
                }

                literalNextSyncInputOffsets[i] = thisMatchOffset;
            }
            else
            {
                literalNextSyncInputOffsets[i] = inputLength;
            }
        }

        if (besti < 0)
        {
            // No literals matched
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = bestMatchOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = bestMatchOffset - matchStart;
            matchStart = bestMatchOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }